

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O3

bool Args::
     eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
               (Context *context,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *container,String *errorDescription,CmdLine *cmdLine)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  logic_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  CmdLine *local_38;
  
  pbVar1 = (context->m_context).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (context->m_it)._M_current;
  local_38 = cmdLine;
  if ((pbVar2 != pbVar1) &&
     (_Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<Args::eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>(Args::Context&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,Args::CmdLine*)::_lambda(std::__cxx11::string_const&)_1_>>
                        (pbVar2,pbVar1,&local_38), _Var4._M_current != pbVar2)) {
    while( true ) {
      pbVar1 = (context->m_context).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (context->m_it)._M_current;
      pbVar5 = pbVar2;
      __x = pbVar1;
      if (pbVar2 != pbVar1) {
        (context->m_it)._M_current = pbVar2 + 1;
        pbVar5 = pbVar2 + 1;
        __x = pbVar2;
      }
      if (__x == _Var4._M_current) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(container,__x);
    }
    if ((_Var4._M_current != pbVar1) &&
       (pbVar5 != (context->m_context).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
      (context->m_it)._M_current = pbVar5 + -1;
    }
    return true;
  }
  this = (logic_error *)__cxa_allocate_exception(0x30);
  pcVar3 = (errorDescription->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + errorDescription->_M_string_length);
  std::logic_error::logic_error(this,"Please use desc() method of the exception.");
  *(undefined ***)this = &PTR__BaseException_00171660;
  *(logic_error **)(this + 0x10) = this + 0x20;
  if (local_58 == &local_48) {
    *(uint *)(this + 0x20) = local_48;
    *(undefined4 *)(this + 0x24) = uStack_44;
    *(undefined4 *)(this + 0x28) = uStack_40;
    *(undefined4 *)(this + 0x2c) = uStack_3c;
  }
  else {
    *(uint **)(this + 0x10) = local_58;
    *(ulong *)(this + 0x20) = CONCAT44(uStack_44,local_48);
  }
  *(undefined8 *)(this + 0x18) = local_50;
  local_50 = 0;
  local_48 = local_48 & 0xffffff00;
  local_58 = &local_48;
  __cxa_throw(this,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

bool eatValues( Ctx & context, Container & container,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto begin = context.begin();

		auto last = std::find_if( context.begin(), context.end(),
			[ & ] ( const String & v ) -> bool
			{
				return( cmdLine->findArgument( v ) != nullptr );
			}
		);

		if( last != begin )
		{
			begin = context.next();

			while( begin != last )
			{
				container.push_back( *begin );

				begin = context.next();
			}

			if( last != context.end() )
				context.putBack();

			return true;
		}
	}

	throw BaseException( errorDescription );
}